

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

uint gpioHardwareRevision(void)

{
  int iVar1;
  FILE *pFVar2;
  char *pcVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  char term;
  char buf [512];
  
  pFVar2 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar2,"%s %s: \n",myTimeStamp::buf,"gpioHardwareRevision");
  }
  if (gpioHardwareRevision::rev == 0) {
    piCores = 0;
    pFVar2 = fopen("/proc/cpuinfo","r");
    if (pFVar2 != (FILE *)0x0) {
      while (pcVar3 = fgets(buf,0x200,pFVar2), pcVar3 != (char *)0x0) {
        if ((piCores == 0) && (iVar1 = strncasecmp("model name",buf,10), iVar1 == 0)) {
          pcVar3 = strstr(buf,"ARMv6");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strstr(buf,"ARMv7");
            uVar6 = 0xc0000000;
            uVar7 = 0x3f000000;
            if (pcVar3 == (char *)0x0) {
              pcVar3 = strstr(buf,"ARMv8");
              uVar4 = 4;
              uVar5 = uVar4;
              if (pcVar3 == (char *)0x0) goto LAB_0010b7a7;
            }
            else {
              uVar4 = 4;
              uVar5 = uVar4;
            }
          }
          else {
            uVar6 = 0x40000000;
            uVar7 = 0x20000000;
            uVar4 = 1;
            uVar5 = 0xc;
          }
          pi_peri_phys = uVar7;
          pi_dram_bus = uVar6;
          pi_mem_flag = uVar5;
          piCores = uVar4;
        }
LAB_0010b7a7:
        iVar1 = strncasecmp("revision\t:",buf,10);
        if (((iVar1 == 0) &&
            (iVar1 = __isoc99_sscanf(buf + 10,"%x%c",&gpioHardwareRevision::rev,&term), iVar1 == 2))
           && (gpioHardwareRevision::rev = gpioHardwareRevision::rev & 0xffffff, term != '\n')) {
          gpioHardwareRevision::rev = 0;
        }
      }
      fclose(pFVar2);
    }
  }
  return gpioHardwareRevision::rev;
}

Assistant:

unsigned gpioHardwareRevision(void)
{
   static unsigned rev = 0;

   FILE * filp;
   char buf[512];
   char term;

   DBG(DBG_USER, "");

   if (rev) return rev;

   piCores = 0;

   filp = fopen ("/proc/cpuinfo", "r");

   if (filp != NULL)
   {
      while (fgets(buf, sizeof(buf), filp) != NULL)
      {
         if (piCores == 0)
         {
            if (!strncasecmp("model name", buf, 10))
            {
               if (strstr (buf, "ARMv6") != NULL)
               {
                  piCores = 1;
                  pi_peri_phys = 0x20000000;
                  pi_dram_bus  = 0x40000000;
                  pi_mem_flag  = 0x0C;
               }
               else if (strstr (buf, "ARMv7") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
               else if (strstr (buf, "ARMv8") != NULL)
               {
                  piCores = 4;
                  pi_peri_phys = 0x3F000000;
                  pi_dram_bus  = 0xC0000000;
                  pi_mem_flag  = 0x04;
               }
            }
         }

         if (!strncasecmp("revision\t:", buf, 10))
         {
            if (sscanf(buf+10, "%x%c", &rev, &term) == 2)
            {
               if (term != '\n') rev = 0;
               else rev &= 0xFFFFFF; /* mask out warranty bit */
            }
         }
      }

      fclose(filp);
   }
   return rev;
}